

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O1

void refineBasis(HighsLp *lp,HighsSolution *solution,HighsBasis *basis)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  HighsBasisStatus HVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  
  bVar3 = solution->value_valid;
  iVar4 = lp->num_col_;
  uVar5 = lp->num_row_;
  if (0 < (long)iVar4) {
    lVar9 = 0;
    do {
      if ((basis->col_status).
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] == kNonbasic) {
        dVar11 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9];
        dVar2 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9];
        if ((dVar11 != dVar2) || (NAN(dVar11) || NAN(dVar2))) {
          bVar6 = highs_isInfinity(-dVar11);
          bVar7 = highs_isInfinity(dVar2);
          if (bVar6) {
            HVar8 = bVar7 | kUpper;
          }
          else {
            if (bVar7) goto LAB_002597da;
            if (bVar3 == false) {
              bVar6 = ABS(dVar2) == ABS(dVar11);
              bVar7 = ABS(dVar2) < ABS(dVar11);
            }
            else {
              dVar11 = (dVar11 + dVar2) * 0.5;
              pdVar1 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar9;
              bVar6 = dVar11 == *pdVar1;
              bVar7 = dVar11 < *pdVar1;
            }
            HVar8 = (bVar7 || bVar6) * '\x02';
          }
        }
        else {
LAB_002597da:
          HVar8 = kLower;
        }
        (basis->col_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar9] = HVar8;
      }
      lVar9 = lVar9 + 1;
    } while (iVar4 != lVar9);
  }
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      if ((basis->row_status).
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] == kNonbasic) {
        dVar11 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10];
        dVar2 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10];
        if ((dVar11 != dVar2) || (NAN(dVar11) || NAN(dVar2))) {
          bVar6 = highs_isInfinity(-dVar11);
          bVar7 = highs_isInfinity(dVar2);
          if (bVar6) {
            HVar8 = bVar7 | kUpper;
          }
          else {
            if (bVar7) goto LAB_002598b0;
            if (bVar3 == false) {
              bVar6 = ABS(dVar2) == ABS(dVar11);
              bVar7 = ABS(dVar2) < ABS(dVar11);
            }
            else {
              dVar11 = (dVar11 + dVar2) * 0.5;
              pdVar1 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar10;
              bVar6 = dVar11 == *pdVar1;
              bVar7 = dVar11 < *pdVar1;
            }
            HVar8 = (bVar7 || bVar6) * '\x02';
          }
        }
        else {
LAB_002598b0:
          HVar8 = kLower;
        }
        (basis->row_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar10] = HVar8;
      }
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  return;
}

Assistant:

void refineBasis(const HighsLp& lp, const HighsSolution& solution,
                 HighsBasis& basis) {
  assert(basis.useful);
  assert(isBasisRightSize(lp, basis));
  const bool have_highs_solution = solution.value_valid;

  const HighsInt num_col = lp.num_col_;
  const HighsInt num_row = lp.num_row_;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (basis.col_status[iCol] != HighsBasisStatus::kNonbasic) continue;
    const double lower = lp.col_lower_[iCol];
    const double upper = lp.col_upper_[iCol];
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    if (lower == upper) {
      status = HighsBasisStatus::kLower;
    } else if (!highs_isInfinity(-lower)) {
      if (!highs_isInfinity(upper)) {
        if (have_highs_solution) {
          if (solution.col_value[iCol] < 0.5 * (lower + upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        } else {
          if (fabs(lower) < fabs(upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        }
      } else {
        status = HighsBasisStatus::kLower;
      }
    } else if (!highs_isInfinity(upper)) {
      status = HighsBasisStatus::kUpper;
    } else {
      status = HighsBasisStatus::kZero;
    }
    assert(status != HighsBasisStatus::kNonbasic);
    basis.col_status[iCol] = status;
  }

  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (basis.row_status[iRow] != HighsBasisStatus::kNonbasic) continue;
    const double lower = lp.row_lower_[iRow];
    const double upper = lp.row_upper_[iRow];
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    if (lower == upper) {
      status = HighsBasisStatus::kLower;
    } else if (!highs_isInfinity(-lower)) {
      if (!highs_isInfinity(upper)) {
        if (have_highs_solution) {
          if (solution.row_value[iRow] < 0.5 * (lower + upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        } else {
          if (fabs(lower) < fabs(upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        }
      } else {
        status = HighsBasisStatus::kLower;
      }
    } else if (!highs_isInfinity(upper)) {
      status = HighsBasisStatus::kUpper;
    } else {
      status = HighsBasisStatus::kZero;
    }
    assert(status != HighsBasisStatus::kNonbasic);
    basis.row_status[iRow] = status;
  }
}